

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,impl *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,size_type end,
          comm *param_5)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference piVar5;
  reference pvVar6;
  iterator iVar7;
  iterator iVar8;
  reference pvVar9;
  allocator<unsigned_long> local_d1;
  value_type_conflict local_d0;
  undefined1 local_c8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  value_type my_splitter;
  size_t bucket_size;
  size_t i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pos;
  allocator<int> local_69;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> local_splitters;
  size_t local_size;
  comm *comm_local;
  size_t s_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  vector<int,_std::allocator<int>_> *result_splitters;
  
  local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = begin._M_current;
  uVar3 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,begin);
  if (uVar3 == 0) {
    assert_fail("local_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                ,0xa1,"sample_block_decomp");
  }
  std::allocator<int>::allocator(&local_69);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,end,&local_69);
  std::allocator<int>::~allocator(&local_69);
  i = (size_t)this;
  for (bucket_size = 0;
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_68), bucket_size < sVar4;
      bucket_size = bucket_size + 1) {
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+=
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i,
               uVar3 / (end + 1) + (long)(int)(uint)(bucket_size < uVar3 % (end + 1)) + -1);
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
    iVar1 = *piVar5;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_68,bucket_size);
    *pvVar6 = iVar1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
  }
  iVar7 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_68);
  iVar8 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_68)
  ;
  bitonic_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (iVar7._M_current,iVar8._M_current,param_5);
  pvVar6 = std::vector<int,_std::allocator<int>_>::back
                     ((vector<int,_std::allocator<int>_> *)local_68);
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = *pvVar6;
  iVar1 = mxx::comm::size(param_5);
  local_d0 = 1;
  std::allocator<unsigned_long>::allocator(&local_d1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,(long)iVar1,&local_d0
             ,&local_d1);
  std::allocator<unsigned_long>::~allocator(&local_d1);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
  *pvVar9 = 0;
  iVar1 = mxx::comm::rank(param_5);
  iVar2 = mxx::comm::size(param_5);
  allgatherv<int>(__return_storage_ptr__,
                  (int *)&recv_sizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(ulong)(iVar1 + 1 < iVar2),
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,param_5);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, size_t s, const mxx::comm& comm) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (size_t i = 0; i < local_splitters.size(); ++i) {
        size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // sort splitters using parallel bitonic sort
    bitonic_sort(local_splitters.begin(), local_splitters.end(), comp, comm);

    // select the last element on each process but the last
    value_type my_splitter = local_splitters.back();
    // allgather splitters (from all but the last processor)
    std::vector<size_t> recv_sizes(comm.size(), 1);
    recv_sizes.back() = 0;
    std::vector<value_type> result_splitters = mxx::allgatherv(&my_splitter, (comm.rank() + 1 < comm.size()) ? 1 : 0, recv_sizes, comm);

    // return resulting splitters
    return result_splitters;
}